

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::shaderexecutor::PackSnorm2x16CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,PackSnorm2x16CaseInstance *this)

{
  pointer *this_00;
  deUint32 dVar1;
  deInt32 dVar2;
  int iVar3;
  size_type sVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  ShaderExecutor *pSVar7;
  reference pvVar8;
  float *pfVar9;
  reference pvVar10;
  float fVar11;
  int local_790;
  int local_78c;
  allocator<char> local_769;
  string local_768;
  undefined4 local_748;
  allocator<char> local_741;
  string local_740;
  int local_71c;
  MessageBuilder local_718;
  MessageBuilder local_598;
  Hex<8UL> local_418;
  Hex<8UL> local_410;
  MessageBuilder local_408;
  int local_288;
  int local_284;
  int diff1;
  int diff0;
  deUint16 res1;
  deUint16 res0;
  deUint32 res;
  deUint32 ref;
  deUint16 ref1;
  deUint16 ref0;
  int valNdx;
  int numFailed;
  int maxPrints;
  int numValues;
  reference local_258;
  void *out;
  void *in;
  MessageBuilder local_240;
  Vector<float,_2> local_bc;
  float local_b4;
  float local_b0;
  float y_1;
  float x_1;
  int ndx_1;
  float local_a0;
  float local_9c;
  float y;
  float x;
  int ndx;
  Vector<float,_2> local_8c;
  Vector<float,_2> local_84;
  Vector<float,_2> local_7c [3];
  Vector<float,_2> local_64;
  int local_5c;
  undefined1 local_58 [4];
  int maxDiff;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> inputs;
  Random rnd;
  PackSnorm2x16CaseInstance *this_local;
  
  dVar1 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  de::Random::Random((Random *)
                     &inputs.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,dVar1 ^ 0x776002);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  if (this->m_precision == PRECISION_HIGHP) {
    local_78c = 1;
  }
  else {
    if (this->m_precision == PRECISION_MEDIUMP) {
      local_790 = 0x21;
    }
    else {
      local_790 = 0;
      if (this->m_precision == PRECISION_LOWP) {
        local_790 = 0x81;
      }
    }
    local_78c = local_790;
  }
  local_5c = local_78c;
  tcu::Vector<float,_2>::Vector(&local_64,0.0,0.0);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_64);
  tcu::Vector<float,_2>::Vector(local_7c,-1.0,1.0);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_7c);
  tcu::Vector<float,_2>::Vector(&local_84,0.5,-0.5);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_84);
  tcu::Vector<float,_2>::Vector(&local_8c,-1.5,1.5);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_8c);
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&x,0.25,-0.75);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(value_type *)&x);
  for (y = 0.0; (int)y < 0xf; y = (float)((int)y + 1)) {
    fVar11 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_9c = fVar11 * 2.5 + -1.25;
    fVar11 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_a0 = fVar11 * 2.5 + -1.25;
    tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&x_1,local_9c,local_a0);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
               &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(value_type *)&x_1);
  }
  for (y_1 = 0.0; (int)y_1 < 0x50; y_1 = (float)((int)y_1 + 1)) {
    fVar11 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_b0 = fVar11 * 1e+06 + -500000.0;
    fVar11 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_b4 = fVar11 * 1e+06 + -500000.0;
    tcu::Vector<float,_2>::Vector(&local_bc,local_b0,local_b4);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
               &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_bc);
  }
  sVar4 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,sVar4);
  pTVar5 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx);
  tcu::TestLog::operator<<(&local_240,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_240,(char (*) [22])"Executing shader for ");
  in = (void *)std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                         ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                          &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(unsigned_long *)&in);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [14])" input values");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_240);
  this_00 = &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  out = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                  ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)this_00
                   ,0);
  local_258 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,0);
  pSVar7 = de::details::
           UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           ::operator->(&(this->super_ShaderPackingFunctionTestInstance).m_executor.
                         super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                       );
  sVar4 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     this_00);
  ::vk::Handle<(vk::HandleType)22>::Handle((Handle<(vk::HandleType)22> *)&maxPrints,0);
  (*pSVar7->_vptr_ShaderExecutor[2])(pSVar7,sVar4 & 0xffffffff,&out,&local_258,_maxPrints);
  sVar4 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  numFailed = (int)sVar4;
  valNdx = 10;
  _ref1 = 0;
  for (ref = 0; (int)ref < numFailed; ref = ref + 1) {
    pvVar8 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)ref);
    pfVar9 = tcu::Vector<float,_2>::x(pvVar8);
    fVar11 = de::clamp<float>(*pfVar9,-1.0,1.0);
    dVar2 = deRoundFloatToInt32(fVar11 * 32767.0);
    iVar3 = de::clamp<int>(dVar2,-0x8000,0x7fff);
    res._2_2_ = (ushort)iVar3;
    pvVar8 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)ref);
    pfVar9 = tcu::Vector<float,_2>::y(pvVar8);
    fVar11 = de::clamp<float>(*pfVar9,-1.0,1.0);
    dVar2 = deRoundFloatToInt32(fVar11 * 32767.0);
    iVar3 = de::clamp<int>(dVar2,-0x8000,0x7fff);
    res._0_2_ = (ushort)iVar3;
    _res1 = CONCAT22((ushort)res,res._2_2_);
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
                         (long)(int)ref);
    diff0 = *pvVar10;
    diff1._2_2_ = (undefined2)diff0;
    diff1._0_2_ = (ushort)((uint)diff0 >> 0x10);
    local_284 = de::abs<int>((uint)res._2_2_ - (diff0 & 0xffffU));
    local_288 = de::abs<int>((uint)(ushort)res - (uint)(ushort)diff1);
    if ((local_5c < local_284) || (local_5c < local_288)) {
      if (_ref1 < 10) {
        pTVar5 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx)
        ;
        tcu::TestLog::operator<<(&local_408,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_408,(char (*) [26])"ERROR: Mismatch in value ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&ref);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [26])", expected packSnorm2x16(");
        pvVar8 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                 operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             *)&outputs.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)ref);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,pvVar8);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [5])0x131b1b7);
        local_410 = tcu::toHex<unsigned_int>(_res1);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_410);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x1386d38);
        local_418 = tcu::toHex<unsigned_int>(diff0);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_418);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])"\n  diffs = (");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_284);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x136aa81);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_288);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])"), max diff = ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_5c);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_408);
      }
      else if (_ref1 == 10) {
        pTVar5 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx)
        ;
        tcu::TestLog::operator<<(&local_598,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<(&local_598,(char (*) [4])"...");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_598);
      }
      _ref1 = _ref1 + 1;
    }
  }
  pTVar5 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx);
  tcu::TestLog::operator<<(&local_718,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  local_71c = numFailed - _ref1;
  pMVar6 = tcu::MessageBuilder::operator<<(&local_718,&local_71c);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])" / ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&numFailed);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])" values passed");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_718);
  if (_ref1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_740,"Pass",&local_741);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_740);
    std::__cxx11::string::~string((string *)&local_740);
    std::allocator<char>::~allocator(&local_741);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_768,"Result comparison failed",&local_769);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_768);
    std::__cxx11::string::~string((string *)&local_768);
    std::allocator<char>::~allocator(&local_769);
  }
  local_748 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  de::Random::~Random((Random *)
                      &inputs.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		de::Random					rnd			(deStringHash(m_name) ^ 0x776002);
		std::vector<tcu::Vec2>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1		:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 33	:		// (2^-10) * (2^15) + 1
												  m_precision == glu::PRECISION_LOWP	? 129	: 0;	// (2^-8) * (2^15) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec2(0.0f, 0.0f));
		inputs.push_back(tcu::Vec2(-1.0f, 1.0f));
		inputs.push_back(tcu::Vec2(0.5f, -0.5f));
		inputs.push_back(tcu::Vec2(-1.5f, 1.5f));
		inputs.push_back(tcu::Vec2(0.25f, -0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*2.5f - 1.25f;
			const float y = rnd.getFloat()*2.5f - 1.25f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 0.5e6f;
			const float y = rnd.getFloat()*1e6f - 0.5e6f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const deUint16	ref0	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), -1.0f, 1.0f) * 32767.0f), -(1<<15), (1<<15)-1);
				const deUint16	ref1	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), -1.0f, 1.0f) * 32767.0f), -(1<<15), (1<<15)-1);
				const deUint32	ref		= (ref1 << 16) | ref0;
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint16)(res & 0xffff);
				const deUint16	res1	= (deUint16)(res >> 16);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packSnorm2x16(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}